

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_accounting.c
# Opt level: O0

int mm_acct_save_TAUTH(void *db,mm_telco_t *telco,char *terminal_id,
                      dlog_mt_funf_card_auth_t *auth_request)

{
  int iVar1;
  char *pcVar2;
  undefined8 in_stack_fffffffffffffc38;
  undefined4 uVar3;
  undefined8 in_stack_fffffffffffffc48;
  undefined4 uVar4;
  char *pcVar5;
  int local_2dc;
  char local_2d8 [4];
  int exp_year;
  char received_time_str [16];
  char call_type_str [38];
  char local_298 [8];
  char card_number_string [25];
  char phone_number_string [21];
  char local_258 [8];
  char sql [512];
  dlog_mt_funf_card_auth_t *auth_request_local;
  char *terminal_id_local;
  mm_telco_t *telco_local;
  void *db_local;
  
  uVar4 = (undefined4)((ulong)in_stack_fffffffffffffc48 >> 0x20);
  uVar3 = (undefined4)((ulong)in_stack_fffffffffffffc38 >> 0x20);
  memset(local_258,0,0x200);
  memset(card_number_string + 0x18,0,0x15);
  memset(local_298,0,0x19);
  memset(received_time_str + 8,0,0x26);
  memset(local_2d8,0,0x10);
  phone_num_to_string(card_number_string + 0x18,0x15,auth_request->phone_number,10);
  phone_num_to_string(local_298,0x19,auth_request->card_number,0xc);
  call_type_to_string(auth_request->call_type & 0x7f,received_time_str + 8,0x26);
  if (0x11 < auth_request->exp_mm) {
    auth_request->exp_mm = '\0';
  }
  if (auth_request->exp_yy < 0x9a) {
    local_2dc = auth_request->exp_yy + 0x2000;
  }
  else {
    local_2dc = 0;
  }
  pcVar5 = received_time_str + 8;
  printf("\t\tCard Auth request: Terminal: %s, Phone number: %s, seq=%d, card#: %s, exp: %02x/%04x, service_code: %d, PIN: %02x, ctrlflag: 0x%02x carrier: %d, Call_type: 0x%02x (%s,) card_ref_num:0x%02x, unk:0x%04x, unk2:0x%04x\n"
         ,terminal_id,card_number_string + 0x18,(ulong)auth_request->seq,local_298,
         (ulong)auth_request->exp_mm,CONCAT44(uVar3,local_2dc),(uint)auth_request->service_code,
         CONCAT44(uVar4,(auth_request->pin & 0xff) << 8 | (int)(auth_request->pin & 0xff00) >> 8),
         (uint)auth_request->control_flag,(uint)auth_request->carrier_ref,
         (uint)auth_request->call_type,pcVar5,(uint)auth_request->card_ref_num,
         (uint)auth_request->unknown,(uint)auth_request->unknown2);
  pcVar2 = received_time_to_db_string(local_2d8,0x10);
  snprintf(local_258,0x200,
           "INSERT INTO TAUTH ( TERMINAL_ID, RECEIVED_DATE, RECEIVED_TIME,INTERNATIONAL_CALL_IND,CALLED_TELEPHONE_NO,CARRIER_XREF_NUMBER,CARD_NUMBER,SERVICE_CODE,CARD_EXPIRY_DATE,INITIAL_DATE,DISCRETIONARY,SPARE_FORMATTED,CARD_DATA,PIN,CALL_TYPE,CARD_REF_NO,SEQUENCE_NO,FOLLOW_ON_IND,TELCO_ID, REGION_CODE) VALUES (  \"%s\",%s,%d,\"%s\",%d,\"%s\",%d,%04x%02x,%04x%02x,%d,%d,%d,%d,%d,%d,%d,%d,\"%c%c\",\"%c%c%c\");"
           ,terminal_id,pcVar2,0,card_number_string + 0x18,(uint)auth_request->carrier_ref,local_298
           ,(uint)auth_request->service_code,local_2dc,(uint)auth_request->exp_mm,
           (ulong)pcVar5 & 0xffffffff00000000,0,(uint)auth_request->control_flag,0,0,
           (auth_request->pin & 0xff) << 8 | (int)(auth_request->pin & 0xff00) >> 8,
           (uint)auth_request->call_type,(uint)auth_request->card_ref_num,(uint)auth_request->seq,
           (uint)((auth_request->control_flag & 4) != 0),(uint)telco->id[0],(uint)telco->id[1],
           (uint)telco->region_code[0],(uint)telco->region_code[1],(uint)telco->region_code[2]);
  iVar1 = mm_sql_exec(db,local_258);
  return iVar1;
}

Assistant:

int mm_acct_save_TAUTH(void *db, mm_telco_t *telco, char* terminal_id, dlog_mt_funf_card_auth_t* auth_request) {
    char sql[512] = { 0 };
    char phone_number_string[21] = { 0 };
    char card_number_string[25] = { 0 };
    char call_type_str[38] = { 0 };
    char received_time_str[16] = { 0 };
    int exp_year;

    phone_num_to_string(phone_number_string, sizeof(phone_number_string), auth_request->phone_number,
        sizeof(auth_request->phone_number));
    phone_num_to_string(card_number_string, sizeof(card_number_string), auth_request->card_number,
        sizeof(auth_request->card_number));
    call_type_to_string(auth_request->call_type & (~FLAG_CDR_IXL), call_type_str, sizeof(call_type_str));

    /* Some calling cards do not contain an expiration date, and the terminal returns 0xee
     * for the exp_mm and exp_yy.  Zero them out in this case.
     */
    if (auth_request->exp_mm >= 0x12) {
        auth_request->exp_mm = 0;
    }

    if (auth_request->exp_yy > 0x99) {
        exp_year = 0;
    }
    else {
        exp_year = 0x2000 + auth_request->exp_yy; /* Fixme: in 2100 */
    }

    printf("\t\tCard Auth request: Terminal: %s, Phone number: %s, seq=%d, card#: %s, exp: %02x/%04x, service_code: %d, PIN: %02x, ctrlflag: 0x%02x carrier: %d, Call_type: 0x%02x (%s,) card_ref_num:0x%02x, unk:0x%04x, unk2:0x%04x\n",
        terminal_id,
        phone_number_string,
        auth_request->seq,
        card_number_string,
        auth_request->exp_mm,
        exp_year,
        auth_request->service_code,
        ((auth_request->pin & 0xFF) << 8) | ((auth_request->pin & 0xFF00) >> 8),
        auth_request->control_flag,
        auth_request->carrier_ref,
        auth_request->call_type,
        call_type_str,
        auth_request->card_ref_num,
        auth_request->unknown,
        auth_request->unknown2);


    snprintf(sql, sizeof(sql), "INSERT " SQL_IGNORE "INTO TAUTH ( TERMINAL_ID, RECEIVED_DATE, RECEIVED_TIME,"
        "INTERNATIONAL_CALL_IND,"
        "CALLED_TELEPHONE_NO,"
        "CARRIER_XREF_NUMBER,"
        "CARD_NUMBER,"
        "SERVICE_CODE,"
        "CARD_EXPIRY_DATE,"
        "INITIAL_DATE,"
        "DISCRETIONARY,"
        "SPARE_FORMATTED,"
        "CARD_DATA,"
        "PIN,"
        "CALL_TYPE,"
        "CARD_REF_NO,"
        "SEQUENCE_NO,"
        "FOLLOW_ON_IND,"
        "TELCO_ID, REGION_CODE"
        ") VALUES ( " \
        " \"%s\",%s,%d,\"%s\",%d,\"%s\",%d,%04x%02x,%04x%02x,%d,%d,%d,%d,%d,%d,%d,%d," TELCO_ID_REGION_CODE ");",
        terminal_id,
        received_time_to_db_string(received_time_str, sizeof(received_time_str)),
        0,
        phone_number_string,
        auth_request->carrier_ref,
        card_number_string,
        auth_request->service_code,
        exp_year,
        auth_request->exp_mm,
        0, //auth_request->init_yy + 0x2000,
        0, //auth_request->init_mm,
        auth_request->control_flag,
        0,
        0,
        ((auth_request->pin & 0xFF) << 8) | ((auth_request->pin & 0xFF00) >> 8),
        auth_request->call_type,
        auth_request->card_ref_num,
        auth_request->seq,
        (auth_request->control_flag & TAUTH_FOLLOW_ON_IND) ? 1 : 0,
        telco->id[0], telco->id[1],
        telco->region_code[0], telco->region_code[1], telco->region_code[2]);

    return mm_sql_exec(db, sql);
}